

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ifDec75.c
# Opt level: O0

int Dau_DsdCheckDecAndExist_rec(char *pStr,char **p,int *pMatches,int *pnSupp)

{
  bool bVar1;
  uint uVar2;
  char *pcVar3;
  char *q_1;
  int local_88;
  uint Mask_1;
  int uSupp;
  int Sum;
  char *q;
  int local_70;
  int nMints;
  int nSimple;
  int nParts;
  int pSupps [8];
  int local_3c;
  int local_38;
  int i;
  int m;
  uint Mask;
  int *pnSupp_local;
  int *pMatches_local;
  char **p_local;
  char *pStr_local;
  
  if (**p == '!') {
    *p = *p + 1;
  }
  while( true ) {
    if (((**p < 'A') || (bVar1 = true, 'F' < **p)) && (bVar1 = false, '/' < **p)) {
      bVar1 = **p < ':';
    }
    if (!bVar1) break;
    *p = *p + 1;
  }
  if ((**p < 'a') || ('z' < **p)) {
    if (**p == '(') {
      i = 0;
      memset(&nSimple,0,0x20);
      nMints = 0;
      local_70 = 0;
      _uSupp = pStr + pMatches[(long)*p - (long)pStr];
      if ((int)*_uSupp != **p + 1 + (uint)(**p != '(')) {
        __assert_fail("*q == **p + 1 + (**p != \'(\')",
                      "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/map/if/ifDec75.c"
                      ,0x8b,"int Dau_DsdCheckDecAndExist_rec(char *, char **, int *, int *)");
      }
      *p = *p + 1;
      while (*p < _uSupp) {
        uVar2 = Dau_DsdCheckDecAndExist_rec(pStr,p,pMatches,&nSimple + nMints);
        i = uVar2 | i;
        local_70 = (uint)((&nSimple)[nMints] == 1) + local_70;
        *pnSupp = (&nSimple)[nMints] + *pnSupp;
        *p = *p + 1;
        nMints = nMints + 1;
      }
      if (*p != _uSupp) {
        __assert_fail("*p == q",
                      "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/map/if/ifDec75.c"
                      ,0x92,"int Dau_DsdCheckDecAndExist_rec(char *, char **, int *, int *)");
      }
      if (nMints < 2) {
        __assert_fail("nParts > 1",
                      "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/map/if/ifDec75.c"
                      ,0x93,"int Dau_DsdCheckDecAndExist_rec(char *, char **, int *, int *)");
      }
      if (0 < local_70) {
        q._4_4_ = 1 << ((byte)nMints & 0x1f);
        for (local_38 = 1; local_38 < q._4_4_; local_38 = local_38 + 1) {
          Mask_1 = 0;
          for (local_3c = 0; local_3c < nMints; local_3c = local_3c + 1) {
            if ((1 < (&nSimple)[local_3c]) && ((local_38 >> ((byte)local_3c & 0x1f) & 1U) != 0)) {
              Mask_1 = (&nSimple)[local_3c] + Mask_1;
            }
          }
          if (8 < (int)Mask_1) {
            __assert_fail("Sum <= 8",
                          "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/map/if/ifDec75.c"
                          ,0x9d,"int Dau_DsdCheckDecAndExist_rec(char *, char **, int *, int *)");
          }
          if (1 < (int)Mask_1) {
            for (local_3c = 0; local_3c < local_70; local_3c = local_3c + 1) {
              i = 1 << ((char)Mask_1 + (char)local_3c & 0x1fU) | i;
            }
          }
        }
        for (local_3c = 2; local_3c < local_70; local_3c = local_3c + 1) {
          i = 1 << ((byte)local_3c & 0x1f) | i;
        }
      }
      pStr_local._4_4_ = i;
    }
    else {
      if (((**p != '<') && (**p != '{')) && (**p != '[')) {
        __assert_fail("0",
                      "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/map/if/ifDec75.c"
                      ,0xb6,"int Dau_DsdCheckDecAndExist_rec(char *, char **, int *, int *)");
      }
      q_1._4_4_ = 0;
      pcVar3 = pStr + pMatches[(long)*p - (long)pStr];
      if ((int)*pcVar3 != **p + 1 + (uint)(**p != '(')) {
        __assert_fail("*q == **p + 1 + (**p != \'(\')",
                      "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/map/if/ifDec75.c"
                      ,0xac,"int Dau_DsdCheckDecAndExist_rec(char *, char **, int *, int *)");
      }
      *p = *p + 1;
      while (*p < pcVar3) {
        local_88 = 0;
        uVar2 = Dau_DsdCheckDecAndExist_rec(pStr,p,pMatches,&local_88);
        q_1._4_4_ = uVar2 | q_1._4_4_;
        *pnSupp = local_88 + *pnSupp;
        *p = *p + 1;
      }
      if (*p != pcVar3) {
        __assert_fail("*p == q",
                      "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/map/if/ifDec75.c"
                      ,0xb3,"int Dau_DsdCheckDecAndExist_rec(char *, char **, int *, int *)");
      }
      pStr_local._4_4_ = q_1._4_4_;
    }
  }
  else {
    *pnSupp = *pnSupp + 1;
    pStr_local._4_4_ = 0;
  }
  return pStr_local._4_4_;
}

Assistant:

int Dau_DsdCheckDecAndExist_rec( char * pStr, char ** p, int * pMatches, int * pnSupp )
{
    if ( **p == '!' )
        (*p)++;
    while ( (**p >= 'A' && **p <= 'F') || (**p >= '0' && **p <= '9') )
        (*p)++;
    if ( **p >= 'a' && **p <= 'z' ) // var
    {
        (*pnSupp)++;
        return 0;
    }
    if ( **p == '(' ) // and
    {
        unsigned Mask = 0;
        int m, i, pSupps[8] = {0}, nParts = 0, nSimple = 0, nMints;
        char * q = pStr + pMatches[ *p - pStr ];
        assert( *q == **p + 1 + (**p != '(') );
        for ( (*p)++; *p < q; (*p)++ )
        {
            Mask |= Dau_DsdCheckDecAndExist_rec( pStr, p, pMatches, &pSupps[nParts] );
            nSimple += (pSupps[nParts] == 1);
            *pnSupp += pSupps[nParts++];
        }
        assert( *p == q );
        assert( nParts > 1 );
        if ( nSimple > 0 )
        {
            nMints = (1 << nParts);
            for ( m = 1; m < nMints; m++ )
            {
                int Sum = 0;
                for ( i = 0; i < nParts; i++ )
                    if ( pSupps[i] > 1 && ((m >> i) & 1) )
                        Sum += pSupps[i];
                assert( Sum <= 8 );
                if ( Sum >= 2 )
                    for ( i = 0; i < nSimple; i++ )
                        Mask |= (1 << (Sum + i));
            }
            for ( i = 2; i < nSimple; i++ )
                Mask |= (1 << i);
        }
        return Mask;
    }
    if ( **p == '<' || **p == '{' || **p == '[' ) // mux/xor/nondec
    {
        int uSupp;
        unsigned Mask = 0;
        char * q = pStr + pMatches[ *p - pStr ];
        assert( *q == **p + 1 + (**p != '(') );
        for ( (*p)++; *p < q; (*p)++ )
        {
            uSupp = 0;
            Mask |= Dau_DsdCheckDecAndExist_rec( pStr, p, pMatches, &uSupp );
            *pnSupp += uSupp;
        }
        assert( *p == q );
        return Mask;
    }
    assert( 0 );
    return 0;
}